

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<signed_char,signed_char,signed_char,duckdb::BinaryLambdaWrapper,bool,signed_char(*)(signed_char,signed_char)>
               (Vector *left,Vector *right,Vector *result,_func_char_char_char *fun)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  _func_char_char_char *fun_00;
  char *pcVar4;
  idx_t in_RCX;
  Vector *in_RDX;
  char *result_data;
  char *rdata;
  char *ldata;
  undefined6 in_stack_ffffffffffffffc0;
  char cVar5;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  pcVar3 = ConstantVector::GetData<signed_char>((Vector *)0x4d6611);
  fun_00 = (_func_char_char_char *)ConstantVector::GetData<signed_char>((Vector *)0x4d6620);
  pcVar4 = ConstantVector::GetData<signed_char>((Vector *)0x4d662f);
  bVar1 = ConstantVector::IsNull((Vector *)0x4d663e);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x4d664c), !bVar1)) {
    cVar2 = *pcVar3;
    cVar5 = (char)*fun_00;
    ConstantVector::Validity(in_RDX);
    cVar2 = BinaryLambdaWrapper::
            Operation<signed_char(*)(signed_char,signed_char),bool,signed_char,signed_char,signed_char>
                      (fun_00,(char)((ulong)pcVar4 >> 0x38),(char)((ulong)pcVar4 >> 0x30),
                       (ValidityMask *)CONCAT17(cVar5,CONCAT16(cVar2,in_stack_ffffffffffffffc0)),
                       in_RCX);
    *pcVar4 = cVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}